

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStoreTestCase.cpp
# Opt level: O1

void __thiscall
resetBeforeAndAfterWithTestFileManager::resetBeforeAndAfterWithTestFileManager
          (resetBeforeAndAfterWithTestFileManager *this)

{
  FileStore *pFVar1;
  SessionID sessionID;
  long *local_328;
  long local_320;
  long local_318 [2];
  long *local_308;
  long local_300;
  long local_2f8 [2];
  long *local_2e8;
  long local_2e0;
  long local_2d8 [2];
  long *local_2c8 [2];
  long local_2b8 [2];
  string local_2a8;
  FieldBase local_288;
  FieldBase local_230;
  FieldBase local_1d8;
  SessionID local_180;
  
  fileStoreFixture::fileStoreFixture((fileStoreFixture *)this,true,true);
  FIX::FileStoreFactory::destroy((MessageStore *)this);
  local_308 = local_2f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_308,"FIX.4.2","");
  local_230._vptr_FieldBase = (_func_int **)&PTR__FieldBase_003239f8;
  local_230.m_tag = 8;
  local_230.m_string._M_dataplus._M_p = (pointer)&local_230.m_string.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_230.m_string,local_308,local_300 + (long)local_308);
  local_230.m_data._M_dataplus._M_p = (pointer)&local_230.m_data.field_2;
  local_230.m_data._M_string_length = 0;
  local_230.m_data.field_2._M_local_buf[0] = '\0';
  local_230.m_metrics.m_length = 0;
  local_230.m_metrics.m_checksum = 0;
  local_230._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00328470;
  local_328 = local_318;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_328,"SETGET","");
  local_288._vptr_FieldBase = (_func_int **)&PTR__FieldBase_003239f8;
  local_288.m_tag = 0x31;
  local_288.m_string._M_dataplus._M_p = (pointer)&local_288.m_string.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_288.m_string,local_328,local_320 + (long)local_328);
  local_288.m_data._M_dataplus._M_p = (pointer)&local_288.m_data.field_2;
  local_288.m_data._M_string_length = 0;
  local_288.m_data.field_2._M_local_buf[0] = '\0';
  local_288.m_metrics.m_length = 0;
  local_288.m_metrics.m_checksum = 0;
  local_288._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00327af0;
  local_2e8 = local_2d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"TEST","");
  local_1d8._vptr_FieldBase = (_func_int **)&PTR__FieldBase_003239f8;
  local_1d8.m_tag = 0x38;
  local_1d8.m_string._M_dataplus._M_p = (pointer)&local_1d8.m_string.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1d8.m_string,local_2e8,local_2e0 + (long)local_2e8);
  local_1d8.m_data._M_dataplus._M_p = (pointer)&local_1d8.m_data.field_2;
  local_1d8.m_data._M_string_length = 0;
  local_1d8.m_data.field_2._M_local_buf[0] = '\0';
  local_1d8.m_metrics.m_length = 0;
  local_1d8.m_metrics.m_checksum = 0;
  local_1d8._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00327ee0;
  local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"Test","");
  FIX::SessionID::SessionID
            (&local_180,&local_230.m_string,&local_288.m_string,&local_1d8.m_string,&local_2a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  FIX::FieldBase::~FieldBase(&local_1d8);
  if (local_2e8 != local_2d8) {
    operator_delete(local_2e8,local_2d8[0] + 1);
  }
  FIX::FieldBase::~FieldBase(&local_288);
  if (local_328 != local_318) {
    operator_delete(local_328,local_318[0] + 1);
  }
  FIX::FieldBase::~FieldBase(&local_230);
  if (local_308 != local_2f8) {
    operator_delete(local_308,local_2f8[0] + 1);
  }
  pFVar1 = (FileStore *)operator_new(0x138);
  FIX::DateTime::nowUtc();
  local_288.m_tag = local_230.m_tag;
  local_288._12_4_ = local_230._12_4_;
  local_288.m_string._M_dataplus._M_p = local_230.m_string._M_dataplus._M_p;
  local_288._vptr_FieldBase = (_func_int **)&PTR__DateTime_00327f88;
  local_2c8[0] = local_2b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2c8,"store","");
  FIX::FileStore::FileStore(pFVar1,&local_288,local_2c8,&local_180);
  (this->super_resetBeforeAndAfterFileStoreFixture).super_fileStoreFixture.object =
       (MessageStore *)pFVar1;
  if (local_2c8[0] != local_2b8) {
    operator_delete(local_2c8[0],local_2b8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.m_frozenString._M_dataplus._M_p != &local_180.m_frozenString.field_2) {
    operator_delete(local_180.m_frozenString._M_dataplus._M_p,
                    local_180.m_frozenString.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.m_sessionQualifier._M_dataplus._M_p != &local_180.m_sessionQualifier.field_2) {
    operator_delete(local_180.m_sessionQualifier._M_dataplus._M_p,
                    local_180.m_sessionQualifier.field_2._M_allocated_capacity + 1);
  }
  FIX::FieldBase::~FieldBase((FieldBase *)&local_180.m_targetCompID);
  FIX::FieldBase::~FieldBase((FieldBase *)&local_180.m_senderCompID);
  FIX::FieldBase::~FieldBase((FieldBase *)&local_180);
  return;
}

Assistant:

resetBeforeAndAfterWithTestFileManager()
      : resetBeforeAndAfterFileStoreFixture() {
    factory.destroy(object);

    SessionID sessionID(BeginString("FIX.4.2"), SenderCompID("SETGET"), TargetCompID("TEST"), "Test");

    object = new FileStore(UtcTimeStamp::now(), "store", sessionID);
  }